

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O2

Index __thiscall
TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
          (TransitionObservationIndependentMADPDiscrete *this,Index sI,Index jaI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  pvVar2 = JointToIndividualStateIndices(this,sI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,pvVar2);
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x60))(this,jaI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,pvVar2);
  SampleSuccessorState
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_58,this,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40);
  IVar1 = IndexTools::IndividualToJointIndicesStepSize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_58,
                     &this->_m_stateStepSize);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  return IVar1;
}

Assistant:

Index SampleSuccessorState(Index sI, Index jaI) const
        {
            std::vector<Index> sIs=JointToIndividualStateIndices(sI);
            std::vector<Index> aIs=JointToIndividualActionIndices(jaI);
            return(IndividualToJointStateIndices(SampleSuccessorState(sIs,aIs)));
        }